

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O0

void secp256k1_musig_session_save
               (secp256k1_musig_session *session,secp256k1_musig_session_internal *session_i)

{
  secp256k1_scalar *psVar1;
  uchar *in_RSI;
  undefined4 *in_RDI;
  uchar *ptr;
  
  *in_RDI = 0x17e9ed9d;
  *(char *)(in_RDI + 1) = (char)*(undefined4 *)in_RSI;
  *(undefined8 *)((long)in_RDI + 5) = *(undefined8 *)(in_RSI + 4);
  *(undefined8 *)((long)in_RDI + 0xd) = *(undefined8 *)(in_RSI + 0xc);
  *(undefined8 *)((long)in_RDI + 0x15) = *(undefined8 *)(in_RSI + 0x14);
  *(undefined8 *)((long)in_RDI + 0x1d) = *(undefined8 *)(in_RSI + 0x1c);
  psVar1 = (secp256k1_scalar *)((long)in_RDI + 0x25);
  secp256k1_scalar_get_b32(in_RSI,psVar1);
  psVar1 = psVar1 + 1;
  secp256k1_scalar_get_b32(in_RSI,psVar1);
  secp256k1_scalar_get_b32(in_RSI,psVar1 + 1);
  return;
}

Assistant:

static void secp256k1_musig_session_save(secp256k1_musig_session *session, const secp256k1_musig_session_internal *session_i) {
    unsigned char *ptr = session->data;

    memcpy(ptr, secp256k1_musig_session_cache_magic, 4);
    ptr += 4;
    *ptr = session_i->fin_nonce_parity;
    ptr += 1;
    memcpy(ptr, session_i->fin_nonce, 32);
    ptr += 32;
    secp256k1_scalar_get_b32(ptr, &session_i->noncecoef);
    ptr += 32;
    secp256k1_scalar_get_b32(ptr, &session_i->challenge);
    ptr += 32;
    secp256k1_scalar_get_b32(ptr, &session_i->s_part);
}